

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

bool anon_unknown.dwarf_13465d::IsLoadAliasedWithStore
               (VmInstruction *loadInst,VmInstruction *storeInst)

{
  uint uVar1;
  VmInstructionType VVar2;
  VmValue **ppVVar3;
  VmValue **ppVVar4;
  VmValue *pVVar5;
  VmValue *pVVar6;
  TypeBase *pTVar7;
  bool bVar8;
  VmValue *pVVar9;
  VmValue *pVVar10;
  
  uVar1 = (loadInst->arguments).count;
  if ((uVar1 == 0) || (uVar1 == 1)) {
LAB_001bb540:
    __assert_fail("index < count",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x199,
                  "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]");
  }
  ppVVar3 = (loadInst->arguments).data;
  pVVar10 = ppVVar3[1];
  if ((pVVar10 == (VmValue *)0x0) || (pVVar10->typeID != 1)) {
    pVVar10 = (VmValue *)0x0;
  }
  uVar1 = (storeInst->arguments).count;
  if ((uVar1 == 0) || (uVar1 == 1)) goto LAB_001bb540;
  ppVVar4 = (storeInst->arguments).data;
  pVVar9 = ppVVar4[1];
  if ((pVVar9 == (VmValue *)0x0) || (pVVar9->typeID != 1)) {
    pVVar9 = (VmValue *)0x0;
  }
  pVVar5 = *ppVVar3;
  pVVar6 = *ppVVar4;
  VVar2 = loadInst->cmd;
  switch(VVar2) {
  case VM_INST_LOAD_BYTE:
    if (storeInst->cmd == VM_INST_STORE_BYTE) goto LAB_001bb4f3;
    switch(VVar2) {
    case VM_INST_LOAD_SHORT:
      goto switchD_001bb451_caseD_1;
    case VM_INST_LOAD_INT:
      goto switchD_001bb451_caseD_2;
    case VM_INST_LOAD_FLOAT:
      goto switchD_001bb451_caseD_3;
    case VM_INST_LOAD_DOUBLE:
      goto switchD_001bb451_caseD_4;
    case VM_INST_LOAD_LONG:
      goto switchD_001bb451_caseD_5;
    }
    break;
  case VM_INST_LOAD_SHORT:
switchD_001bb451_caseD_1:
    if (storeInst->cmd == VM_INST_STORE_SHORT) goto LAB_001bb4f3;
    switch(VVar2) {
    case VM_INST_LOAD_INT:
      goto switchD_001bb451_caseD_2;
    case VM_INST_LOAD_FLOAT:
      goto switchD_001bb451_caseD_3;
    case VM_INST_LOAD_DOUBLE:
      goto switchD_001bb451_caseD_4;
    case VM_INST_LOAD_LONG:
      goto switchD_001bb451_caseD_5;
    }
    break;
  case VM_INST_LOAD_INT:
switchD_001bb451_caseD_2:
    if (storeInst->cmd == VM_INST_STORE_INT) goto LAB_001bb4f3;
    if (VVar2 == VM_INST_LOAD_FLOAT) goto switchD_001bb451_caseD_3;
    if (VVar2 == VM_INST_LOAD_DOUBLE) goto switchD_001bb451_caseD_4;
    if (VVar2 == VM_INST_LOAD_LONG) goto switchD_001bb451_caseD_5;
    break;
  case VM_INST_LOAD_FLOAT:
switchD_001bb451_caseD_3:
    if (storeInst->cmd == VM_INST_STORE_FLOAT) goto LAB_001bb4f3;
    if (VVar2 == VM_INST_LOAD_DOUBLE) goto switchD_001bb451_caseD_4;
    break;
  case VM_INST_LOAD_DOUBLE:
switchD_001bb451_caseD_4:
    if (storeInst->cmd != VM_INST_STORE_DOUBLE) break;
    goto LAB_001bb4f3;
  case VM_INST_LOAD_LONG:
switchD_001bb451_caseD_5:
    if (storeInst->cmd == VM_INST_STORE_LONG) goto LAB_001bb4f3;
    if (VVar2 == VM_INST_LOAD_DOUBLE) goto switchD_001bb451_caseD_4;
    if (VVar2 == VM_INST_LOAD_FLOAT) goto switchD_001bb451_caseD_3;
  }
  bVar8 = IsBuiltInStructLoadStore(loadInst);
  if ((bVar8) && (bVar8 = IsBuiltInStructLoadStore(storeInst), bVar8)) {
LAB_001bb4f3:
    pTVar7 = (pVVar5->type).structType;
    if (((pTVar7 == (TypeBase *)0x0) || (pTVar7 != (pVVar6->type).structType)) ||
       (*(int *)&pVVar10[1]._vptr_VmValue == *(int *)&pVVar9[1]._vptr_VmValue)) {
      bVar8 = true;
    }
    else {
      bVar8 = false;
    }
  }
  else {
    bVar8 = true;
    if (loadInst->cmd != VM_INST_LOAD_STRUCT) {
      bVar8 = storeInst->cmd == VM_INST_STORE_STRUCT;
    }
  }
  return bVar8;
}

Assistant:

VmInstructionType GetStoreInstruction(ExpressionContext &ctx, TypeBase *type)
	{
		if(type == ctx.typeBool || type == ctx.typeChar)
			return VM_INST_STORE_BYTE;

		if(type == ctx.typeShort)
			return VM_INST_STORE_SHORT;

		if(type == ctx.typeInt)
			return VM_INST_STORE_INT;

		if(type == ctx.typeFloat)
			return VM_INST_STORE_FLOAT;

		if(type == ctx.typeDouble)
			return VM_INST_STORE_DOUBLE;

		if(type == ctx.typeLong)
			return VM_INST_STORE_LONG;

		if(isType<TypeRef>(type))
			return VM_INST_STORE_POINTER;

		if(isType<TypeEnum>(type))
			return VM_INST_STORE_INT;

		if(isType<TypeFunction>(type) || isType<TypeUnsizedArray>(type) || type == ctx.typeAutoRef || type == ctx.typeAutoArray)
			return VM_INST_STORE_STRUCT;

		if(isType<TypeTypeID>(type) || isType<TypeFunctionID>(type) || isType<TypeEnum>(type))
			return VM_INST_STORE_INT;

		if(isType<TypeNullptr>(type))
			return VM_INST_STORE_POINTER;

		assert(type->size != 0);
		assert(type->size % 4 == 0);
		assert(type->size < NULLC_MAX_TYPE_SIZE);

		return VM_INST_STORE_STRUCT;
	}